

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_err_t sl_initialize(ion_skiplist_t *skiplist,ion_key_type_t key_type,int key_size,int value_size
                       ,int maxheight,int pnum,int pden)

{
  ion_sl_node_t *piVar1;
  sl_node **ppsVar2;
  int local_28;
  int pnum_local;
  int maxheight_local;
  int value_size_local;
  int key_size_local;
  ion_key_type_t key_type_local;
  ion_skiplist_t *skiplist_local;
  
  (skiplist->super).key_type = key_type;
  (skiplist->super).record.key_size = key_size;
  (skiplist->super).record.value_size = value_size;
  skiplist->maxheight = maxheight;
  skiplist->pden = pden;
  skiplist->pnum = pnum;
  piVar1 = (ion_sl_node_t *)malloc(0x20);
  skiplist->head = piVar1;
  if (skiplist->head == (ion_sl_node_t *)0x0) {
    skiplist_local._7_1_ = '\x06';
  }
  else {
    ppsVar2 = (sl_node **)malloc((long)skiplist->maxheight << 5);
    skiplist->head->next = ppsVar2;
    if (skiplist->head->next == (sl_node **)0x0) {
      free(skiplist->head);
      skiplist->head = (ion_sl_node_t *)0x0;
      skiplist_local._7_1_ = '\x06';
    }
    else {
      skiplist->head->height = maxheight + -1;
      skiplist->head->key = (ion_key_t)0x0;
      skiplist->head->value = (ion_value_t)0x0;
      local_28 = maxheight;
      while (local_28 = local_28 + -1, -1 < local_28) {
        skiplist->head->next[local_28] = (sl_node *)0x0;
      }
      skiplist_local._7_1_ = '\0';
    }
  }
  return skiplist_local._7_1_;
}

Assistant:

ion_err_t
sl_initialize(
	ion_skiplist_t	*skiplist,
	ion_key_type_t	key_type,
	int				key_size,
	int				value_size,
	int				maxheight,
	int				pnum,
	int				pden
) {
	/* srand(time(NULL)); */

	skiplist->super.key_type			= key_type;
	skiplist->super.record.key_size		= key_size;
	skiplist->super.record.value_size	= value_size;
	skiplist->maxheight					= maxheight;

	skiplist->pden						= pden;
	skiplist->pnum						= pnum;

#if ION_DEBUG
	DUMP(skip_list->super.record.key_size, "%d");
	DUMP(skip_list->super.record.value_size, "%d");
	DUMP(skip_list->maxheight, "%d");
	DUMP(skip_list->pnum, "%d");
	DUMP(skip_list->pden, "%d");
	printf("%s", "\n");
#endif

	skiplist->head = malloc(sizeof(ion_sl_node_t));

	if (NULL == skiplist->head) {
		return err_out_of_memory;
	}

	skiplist->head->next = malloc(sizeof(ion_sl_node_t) * skiplist->maxheight);

	if (NULL == skiplist->head->next) {
		free(skiplist->head);
		skiplist->head = NULL;
		return err_out_of_memory;
	}

	skiplist->head->height	= maxheight - 1;
	skiplist->head->key		= NULL;
	skiplist->head->value	= NULL;

	while (--maxheight >= 0) {
		skiplist->head->next[maxheight] = NULL;
	}

	return err_ok;
}